

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O0

bool P_TestMobjLocation(AActor *mobj)

{
  AActor *thing;
  bool bVar1;
  double dVar2;
  TFlags<ActorFlag,_unsigned_int> local_58;
  TFlags<ActorFlag,_unsigned_int> local_54;
  DVector3 local_50;
  TVector2<double> local_38;
  Self local_24;
  TFlags<ActorFlag,_unsigned_int> local_20;
  TFlags<ActorFlag,_unsigned_int> local_1c;
  AActor *pAStack_18;
  ActorFlags flags;
  AActor *mobj_local;
  
  pAStack_18 = mobj;
  TFlags<ActorFlag,_unsigned_int>::TFlags(&local_1c);
  TFlags<ActorFlag,_unsigned_int>::TFlags(&local_20,&pAStack_18->flags);
  TFlags<ActorFlag,_unsigned_int>::operator=(&local_1c,&local_20);
  operator~((EnumType)&local_24);
  TFlags<ActorFlag,_unsigned_int>::operator&=(&pAStack_18->flags,&local_24);
  thing = pAStack_18;
  AActor::Pos(&local_50,pAStack_18);
  TVector2<double>::TVector2(&local_38,&local_50);
  bVar1 = P_CheckPosition(thing,&local_38,false);
  if (bVar1) {
    TFlags<ActorFlag,_unsigned_int>::TFlags(&local_54,&local_1c);
    TFlags<ActorFlag,_unsigned_int>::operator=(&pAStack_18->flags,&local_54);
    dVar2 = AActor::Z(pAStack_18);
    if ((pAStack_18->floorz <= dVar2) &&
       (dVar2 = AActor::Top(pAStack_18),
       dVar2 < pAStack_18->ceilingz || dVar2 == pAStack_18->ceilingz)) {
      return true;
    }
  }
  else {
    TFlags<ActorFlag,_unsigned_int>::TFlags(&local_58,&local_1c);
    TFlags<ActorFlag,_unsigned_int>::operator=(&pAStack_18->flags,&local_58);
  }
  return false;
}

Assistant:

bool P_TestMobjLocation(AActor *mobj)
{
	ActorFlags flags;

	flags = mobj->flags;
	mobj->flags &= ~MF_PICKUP;
	if (P_CheckPosition(mobj, mobj->Pos()))
	{ // XY is ok, now check Z
		mobj->flags = flags;
		if ((mobj->Z() < mobj->floorz) || (mobj->Top() > mobj->ceilingz))
		{ // Bad Z
			return false;
		}
		return true;
	}
	mobj->flags = flags;
	return false;
}